

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

bool __thiscall Character::AddItem(Character *this,short item,int amount)

{
  size_t *psVar1;
  EIF *pEVar2;
  World *pWVar3;
  int iVar4;
  ulong uVar5;
  mapped_type *this_00;
  _List_node_base *p_Var6;
  ulong uVar7;
  int iVar8;
  key_type local_48;
  
  if ((0 < item && 0 < amount) &&
     (uVar7 = (ulong)(ushort)item, pEVar2 = this->world->eif,
     uVar5 = ((long)(pEVar2->data).
                    super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pEVar2->data).
                    super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,
     uVar7 <= uVar5 && uVar5 - uVar7 != 0)) {
    p_Var6 = (_List_node_base *)&this->inventory;
    do {
      p_Var6 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)&p_Var6->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var6 == (_List_node_base *)&this->inventory) {
        p_Var6 = (_List_node_base *)operator_new(0x18);
        p_Var6[1]._M_next = (_List_node_base *)((ulong)(uint)amount << 0x20 | uVar7);
        std::__detail::_List_node_base::_M_hook(p_Var6);
        psVar1 = &(this->inventory).
                  super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl._M_node.
                  _M_size;
        *psVar1 = *psVar1 + 1;
        goto LAB_001171ca;
      }
    } while (*(short *)&p_Var6[1]._M_next != item);
    iVar8 = amount + *(int *)((long)&p_Var6[1]._M_next + 4);
    if (-1 < iVar8) {
      *(int *)((long)&p_Var6[1]._M_next + 4) = iVar8;
      pWVar3 = this->world;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"MaxItem","");
      this_00 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar3->config,&local_48);
      iVar4 = util::variant::GetInt(this_00);
      iVar8 = *(int *)((long)&p_Var6[1]._M_next + 4);
      if (iVar4 < iVar8) {
        iVar8 = iVar4;
      }
      *(int *)((long)&p_Var6[1]._M_next + 4) = iVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
LAB_001171ca:
      CalculateStats(this,true);
      return true;
    }
  }
  return false;
}

Assistant:

bool Character::AddItem(short item, int amount)
{
	if (amount <= 0)
	{
		return false;
	}

	if (item <= 0 || static_cast<std::size_t>(item) >= this->world->eif->data.size())
	{
		return false;
	}

	UTIL_IFOREACH(this->inventory, it)
	{
		if (it->id == item)
		{
			if (it->amount + amount < 0)
			{
				return false;
			}

			it->amount += amount;

			it->amount = std::min<int>(it->amount, this->world->config["MaxItem"]);

			this->CalculateStats();

			return true;
		}
	}

	Character_Item newitem;
	newitem.id = item;
	newitem.amount = amount;

	this->inventory.push_back(newitem);

	this->CalculateStats();

	return true;
}